

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_ctl.c
# Opt level: O0

void vsnapshot_tilde_bang(t_vsnapshot *x)

{
  double dVar1;
  int local_18;
  t_float local_14;
  int indx;
  t_sample val;
  t_vsnapshot *x_local;
  
  if (x->x_gotone == 0) {
    local_14 = 0.0;
  }
  else {
    dVar1 = clock_gettimesince(x->x_time);
    local_18 = (int)(dVar1 * (double)x->x_sampspermsec);
    if (local_18 < 0) {
      local_18 = 0;
    }
    else if (x->x_n <= local_18) {
      local_18 = x->x_n + -1;
    }
    local_14 = x->x_vec[local_18];
  }
  outlet_float((x->x_obj).te_outlet,local_14);
  return;
}

Assistant:

static void vsnapshot_tilde_bang(t_vsnapshot *x)
{
    t_sample val;
    if (x->x_gotone)
    {
        int indx = clock_gettimesince(x->x_time) * x->x_sampspermsec;
        if (indx < 0)
            indx = 0;
        else if (indx >= x->x_n)
            indx = x->x_n - 1;
        val = x->x_vec[indx];
    }
    else val = 0;
    outlet_float(x->x_obj.ob_outlet, val);
}